

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O2

int AMPLSReportResults(AMPLS_MP_Solver *slv,char *solFileName)

{
  long *plVar1;
  allocator<char> local_41;
  string local_40 [32];
  
  plVar1 = *slv->internal_info_;
  if (solFileName == (char *)0x0) {
    solFileName = "";
  }
  std::__cxx11::string::string<std::allocator<char>>(local_40,solFileName,&local_41);
  std::__cxx11::string::_M_assign((string *)(plVar1 + 0x61));
  std::__cxx11::string::~string(local_40);
  (**(code **)(*plVar1 + 0x90))(plVar1);
  return 0;
}

Assistant:

int AMPLSReportResults(AMPLS_MP_Solver* slv, const char* solFileName = NULL) {
  return AMPLS__internal__TryCatchWrapper( slv, [=]() {
    auto be = AMPLSGetBackend(slv);
    // If solFileName is NULL, we scrap any previous override
    be->OverrideSolutionFile(solFileName == NULL ? "" : solFileName);
    be->ReportResults();
  } );
}